

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O0

string * __thiscall
czh::utils::dtoa_abi_cxx11_(string *__return_storage_ptr__,utils *this,double *value)

{
  uint64_t uVar1;
  string *this_00;
  double v;
  string local_70;
  undefined1 local_50 [8];
  string buffer;
  allocator<char> local_19;
  utils *local_18;
  double *value_local;
  
  local_18 = this;
  value_local = (double *)__return_storage_ptr__;
  if (((*(double *)this == 0.0) && (!NAN(*(double *)this))) &&
     (uVar1 = double_to_uint64((double *)this), (uVar1 & 0x8000000000000000) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"-0.0",&local_19);
    std::allocator<char>::~allocator(&local_19);
    return __return_storage_ptr__;
  }
  this_00 = (string *)local_50;
  std::__cxx11::string::string(this_00);
  if ((*(double *)local_18 != 0.0) || (NAN(*(double *)local_18))) {
    std::abs((int)this_00);
    fill_double_abi_cxx11_(&local_70,this,v);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               &local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,"0.0");
  }
  if (0.0 < *(double *)local_18 || *(double *)local_18 == 0.0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  }
  else {
    std::operator+(__return_storage_ptr__,"-",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  }
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string dtoa(const double &value)
  {
    if (value == 0 && ((double_to_uint64(value) & SIGN_MASK) != 0))
    {
      return "-0.0";
    }
    std::string buffer;
    if (value == 0)
    {
      buffer = "0.0";
    }
    else
    {
      buffer = fill_double(std::abs(value));
    }
    if (value < 0)
    {
      return "-" + buffer;
    }
    return std::move(buffer);
  }